

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::AggregationPS::execute
          (AggregationPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint *puVar1;
  int iVar2;
  pointer pnVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  type_conflict5 tVar5;
  bool bVar6;
  ostream *poVar7;
  VarStatus *pVVar8;
  double *pdVar9;
  SPxInternalCodeException *this_00;
  VarStatus VVar10;
  int iVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *b;
  long lVar12;
  int k;
  long lVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  cpp_dec_float<50U,_int,_void> local_6f8;
  cpp_dec_float<50U,_int,_void> *local_6b8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  dualVal;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  cpp_dec_float<50U,_int,_void> local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_578;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_478;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_378;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_338;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_278;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  int local_1d0;
  undefined1 local_1cc;
  undefined8 local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  if (this->m_i != this->m_old_i) {
    pnVar3 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar3[this->m_old_i].m_backend,&pnVar3[this->m_i].m_backend);
    pnVar3 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar3[this->m_old_i].m_backend,&pnVar3[this->m_i].m_backend);
    rStatus->data[this->m_old_i] = rStatus->data[this->m_i];
  }
  b = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
       *)(long)this->m_j;
  local_6b0 = s;
  if (this->m_j != this->m_old_j) {
    pnVar3 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar3[this->m_old_j].m_backend,&pnVar3[(long)b].m_backend);
    pnVar3 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar3[this->m_old_j].m_backend,&pnVar3[this->m_j].m_backend);
    b = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)cStatus->data;
    (b->m_backend).data._M_elems[this->m_old_j] = (b->m_backend).data._M_elems[this->m_j];
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_6f8,0.0,(type *)0x0);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[](&aij,&(this->m_row).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_j);
  iVar11 = -1;
  for (lVar12 = 0; lVar12 != 0x78; lVar12 = lVar12 + 0x3c) {
    pNVar4 = (this->m_row).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    iVar2 = *(int *)((long)(&pNVar4->val + 1) + lVar12);
    if (iVar2 != this->m_j) {
      scale.m_backend.fpclass = cpp_dec_float_finite;
      scale.m_backend.prec_elem = 10;
      scale.m_backend.data._M_elems[0] = 0;
      scale.m_backend.data._M_elems[1] = 0;
      scale.m_backend.data._M_elems[2] = 0;
      scale.m_backend.data._M_elems[3] = 0;
      scale.m_backend.data._M_elems[4] = 0;
      scale.m_backend.data._M_elems[5] = 0;
      scale.m_backend.data._M_elems._24_5_ = 0;
      scale.m_backend.data._M_elems[7]._1_3_ = 0;
      scale.m_backend.data._M_elems._32_5_ = 0;
      scale.m_backend.data._M_elems[9]._1_3_ = 0;
      scale.m_backend.exp = 0;
      scale.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&scale.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)(pNVar4->val).m_backend.data._M_elems + lVar12),
                 &(x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend);
      local_6f8.data._M_elems[9]._1_3_ = scale.m_backend.data._M_elems[9]._1_3_;
      local_6f8.data._M_elems._32_5_ = scale.m_backend.data._M_elems._32_5_;
      local_6f8.data._M_elems[7]._1_3_ = scale.m_backend.data._M_elems[7]._1_3_;
      local_6f8.data._M_elems._24_5_ = scale.m_backend.data._M_elems._24_5_;
      local_6f8.data._M_elems[4] = scale.m_backend.data._M_elems[4];
      local_6f8.data._M_elems[5] = scale.m_backend.data._M_elems[5];
      local_6f8.data._M_elems[0] = scale.m_backend.data._M_elems[0];
      local_6f8.data._M_elems[1] = scale.m_backend.data._M_elems[1];
      local_6f8.data._M_elems[2] = scale.m_backend.data._M_elems[2];
      local_6f8.data._M_elems[3] = scale.m_backend.data._M_elems[3];
      local_6f8.exp = scale.m_backend.exp;
      local_6f8.neg = scale.m_backend.neg;
      local_6f8.fpclass = scale.m_backend.fpclass;
      local_6f8.prec_elem = scale.m_backend.prec_elem;
      iVar11 = iVar2;
    }
  }
  local_1f8 = *(undefined8 *)(this->m_rhs).m_backend.data._M_elems;
  uStack_1f0 = *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 2);
  local_1e8 = *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 4);
  uStack_1e0 = *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 6);
  local_1d8 = *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 8);
  local_1d0 = (this->m_rhs).m_backend.exp;
  local_1cc = (this->m_rhs).m_backend.neg;
  local_1c8._0_4_ = (this->m_rhs).m_backend.fpclass;
  local_1c8._4_4_ = (this->m_rhs).m_backend.prec_elem;
  local_238.m_backend.data._M_elems[1] = local_6f8.data._M_elems[1];
  local_238.m_backend.data._M_elems[0] = local_6f8.data._M_elems[0];
  local_238.m_backend.data._M_elems[3] = local_6f8.data._M_elems[3];
  local_238.m_backend.data._M_elems[2] = local_6f8.data._M_elems[2];
  local_238.m_backend.data._M_elems[4] = local_6f8.data._M_elems[4];
  local_238.m_backend.data._M_elems[5] = local_6f8.data._M_elems[5];
  local_238.m_backend.data._M_elems[6] = local_6f8.data._M_elems[6];
  local_238.m_backend.data._M_elems[7] = local_6f8.data._M_elems[7];
  local_238.m_backend.data._M_elems[8] = local_6f8.data._M_elems[8];
  local_238.m_backend.data._M_elems[9] = local_6f8.data._M_elems[9];
  local_238.m_backend.exp = local_6f8.exp;
  local_238.m_backend.neg = local_6f8.neg;
  local_238.m_backend.fpclass = local_6f8.fpclass;
  local_238.m_backend.prec_elem = local_6f8.prec_elem;
  maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&scale,(soplex *)&local_1f8,&local_238,b);
  result_2.m_backend.data._M_elems[0] = 0;
  result_2.m_backend.data._M_elems[1] = 0x3ff00000;
  tVar5 = boost::multiprecision::operator<(&scale,(double *)&result_2);
  if (tVar5) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&scale,1.0);
  }
  dualVal.m_backend.fpclass = cpp_dec_float_finite;
  dualVal.m_backend.prec_elem = 10;
  dualVal.m_backend.data._M_elems[0] = 0;
  dualVal.m_backend.data._M_elems[1] = 0;
  dualVal.m_backend.data._M_elems[2] = 0;
  dualVal.m_backend.data._M_elems[3] = 0;
  dualVal.m_backend.data._M_elems[4] = 0;
  dualVal.m_backend.data._M_elems[5] = 0;
  dualVal.m_backend.data._M_elems._24_5_ = 0;
  dualVal.m_backend.data._M_elems[7]._1_3_ = 0;
  dualVal.m_backend.data._M_elems._32_5_ = 0;
  dualVal.m_backend.data._M_elems[9]._1_3_ = 0;
  dualVal.m_backend.exp = 0;
  dualVal.m_backend.neg = false;
  local_6b8 = &(this->m_rhs).m_backend;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&dualVal.m_backend,&(this->m_rhs).m_backend,&scale.m_backend);
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 10;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems._24_5_ = 0;
  result_1.m_backend.data._M_elems[7]._1_3_ = 0;
  result_1.m_backend.data._M_elems._32_5_ = 0;
  result_1.m_backend.data._M_elems[9]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_1.m_backend,&local_6f8,&scale.m_backend);
  result_2.m_backend.fpclass = cpp_dec_float_finite;
  result_2.m_backend.prec_elem = 10;
  result_2.m_backend.data._M_elems[0] = 0;
  result_2.m_backend.data._M_elems[1] = 0;
  result_2.m_backend.data._M_elems[2] = 0;
  result_2.m_backend.data._M_elems[3] = 0;
  result_2.m_backend.data._M_elems[4] = 0;
  result_2.m_backend.data._M_elems[5] = 0;
  result_2.m_backend.data._M_elems[6] = 0;
  result_2.m_backend.data._M_elems[7] = 0;
  result_2.m_backend.data._M_elems._32_5_ = 0;
  result_2.m_backend.data._M_elems[9]._1_3_ = 0;
  result_2.m_backend.exp = 0;
  result_2.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_2.m_backend,&dualVal.m_backend,&result_1.m_backend);
  local_278.m_backend.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
  local_278.m_backend.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
  local_278.m_backend.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
  local_278.m_backend.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
  local_278.m_backend.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
  local_278.m_backend.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
  local_278.m_backend.data._M_elems[6] = result_2.m_backend.data._M_elems[6];
  local_278.m_backend.data._M_elems[7] = result_2.m_backend.data._M_elems[7];
  local_278.m_backend.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
  local_278.m_backend.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
  local_278.m_backend.exp = result_2.m_backend.exp;
  local_278.m_backend.neg = result_2.m_backend.neg;
  local_278.m_backend.fpclass = result_2.m_backend.fpclass;
  local_278.m_backend.prec_elem = result_2.m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_68,this);
  bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_278,&local_68);
  if (bVar6) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,0.0);
  }
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 10;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems._24_5_ = 0;
  result_1.m_backend.data._M_elems[7]._1_3_ = 0;
  result_1.m_backend.data._M_elems._32_5_ = 0;
  result_1.m_backend.data._M_elems[9]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_1.m_backend,&result_2.m_backend,&scale.m_backend);
  dualVal.m_backend.fpclass = cpp_dec_float_finite;
  dualVal.m_backend.prec_elem = 10;
  dualVal.m_backend.data._M_elems[0] = 0;
  dualVal.m_backend.data._M_elems[1] = 0;
  dualVal.m_backend.data._M_elems[2] = 0;
  dualVal.m_backend.data._M_elems[3] = 0;
  dualVal.m_backend.data._M_elems[4] = 0;
  dualVal.m_backend.data._M_elems[5] = 0;
  dualVal.m_backend.data._M_elems._24_5_ = 0;
  dualVal.m_backend.data._M_elems[7]._1_3_ = 0;
  dualVal.m_backend.data._M_elems._32_5_ = 0;
  dualVal.m_backend.data._M_elems[9]._1_3_ = 0;
  dualVal.m_backend.exp = 0;
  dualVal.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&dualVal.m_backend,&result_1.m_backend,&aij.m_backend);
  iVar2 = this->m_j;
  pnVar3 = (x->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar3[iVar2].m_backend.data._M_elems + 8) =
       CONCAT35(dualVal.m_backend.data._M_elems[9]._1_3_,dualVal.m_backend.data._M_elems._32_5_);
  puVar1 = pnVar3[iVar2].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = dualVal.m_backend.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(dualVal.m_backend.data._M_elems[7]._1_3_,dualVal.m_backend.data._M_elems._24_5_);
  *(undefined8 *)&pnVar3[iVar2].m_backend.data = dualVal.m_backend.data._M_elems._0_8_;
  *(undefined8 *)(pnVar3[iVar2].m_backend.data._M_elems + 2) = dualVal.m_backend.data._M_elems._8_8_
  ;
  pnVar3[iVar2].m_backend.exp = dualVal.m_backend.exp;
  pnVar3[iVar2].m_backend.neg = dualVal.m_backend.neg;
  pnVar3[iVar2].m_backend.fpclass = dualVal.m_backend.fpclass;
  pnVar3[iVar2].m_backend.prec_elem = dualVal.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&(local_6b0->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,local_6b8);
  if (isOptimal) {
    iVar2 = this->m_j;
    pnVar3 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_2b8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar3[iVar2].m_backend.data._M_elems + 8);
    local_2b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar2].m_backend.data;
    local_2b8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar3[iVar2].m_backend.data._M_elems + 2);
    puVar1 = pnVar3[iVar2].m_backend.data._M_elems + 4;
    local_2b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_2b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_2b8.m_backend.exp = pnVar3[iVar2].m_backend.exp;
    local_2b8.m_backend.neg = pnVar3[iVar2].m_backend.neg;
    local_2b8.m_backend.fpclass = pnVar3[iVar2].m_backend.fpclass;
    local_2b8.m_backend.prec_elem = pnVar3[iVar2].m_backend.prec_elem;
    local_2f8.m_backend.data._M_elems[0] = (this->m_lower).m_backend.data._M_elems[0];
    local_2f8.m_backend.data._M_elems[1] = (this->m_lower).m_backend.data._M_elems[1];
    local_2f8.m_backend.data._M_elems[2] = (this->m_lower).m_backend.data._M_elems[2];
    local_2f8.m_backend.data._M_elems[3] = (this->m_lower).m_backend.data._M_elems[3];
    local_2f8.m_backend.data._M_elems[4] = (this->m_lower).m_backend.data._M_elems[4];
    local_2f8.m_backend.data._M_elems[5] = (this->m_lower).m_backend.data._M_elems[5];
    local_2f8.m_backend.data._M_elems[6] = (this->m_lower).m_backend.data._M_elems[6];
    local_2f8.m_backend.data._M_elems[7] = (this->m_lower).m_backend.data._M_elems[7];
    local_2f8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 8);
    local_2f8.m_backend.exp = (this->m_lower).m_backend.exp;
    local_2f8.m_backend.neg = (this->m_lower).m_backend.neg;
    local_2f8.m_backend.fpclass = (this->m_lower).m_backend.fpclass;
    local_2f8.m_backend.prec_elem = (this->m_lower).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_a0,this);
    bVar6 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_2b8,&local_2f8,&local_a0);
    if (!bVar6) {
      iVar2 = this->m_j;
      pnVar3 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_338.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar3[iVar2].m_backend.data._M_elems + 8);
      local_338.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar2].m_backend.data;
      local_338.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar3[iVar2].m_backend.data._M_elems + 2);
      puVar1 = pnVar3[iVar2].m_backend.data._M_elems + 4;
      local_338.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_338.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_338.m_backend.exp = pnVar3[iVar2].m_backend.exp;
      local_338.m_backend.neg = pnVar3[iVar2].m_backend.neg;
      local_338.m_backend.fpclass = pnVar3[iVar2].m_backend.fpclass;
      local_338.m_backend.prec_elem = pnVar3[iVar2].m_backend.prec_elem;
      local_378.m_backend.data._M_elems[0] = (this->m_upper).m_backend.data._M_elems[0];
      local_378.m_backend.data._M_elems[1] = (this->m_upper).m_backend.data._M_elems[1];
      local_378.m_backend.data._M_elems[2] = (this->m_upper).m_backend.data._M_elems[2];
      local_378.m_backend.data._M_elems[3] = (this->m_upper).m_backend.data._M_elems[3];
      local_378.m_backend.data._M_elems[4] = (this->m_upper).m_backend.data._M_elems[4];
      local_378.m_backend.data._M_elems[5] = (this->m_upper).m_backend.data._M_elems[5];
      local_378.m_backend.data._M_elems[6] = (this->m_upper).m_backend.data._M_elems[6];
      local_378.m_backend.data._M_elems[7] = (this->m_upper).m_backend.data._M_elems[7];
      local_378.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 8);
      local_378.m_backend.exp = (this->m_upper).m_backend.exp;
      local_378.m_backend.neg = (this->m_upper).m_backend.neg;
      local_378.m_backend.fpclass = (this->m_upper).m_backend.fpclass;
      local_378.m_backend.prec_elem = (this->m_upper).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_d8,this);
      bVar6 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_338,&local_378,&local_d8);
      if (!bVar6) goto LAB_00276bf6;
    }
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "EMAISM: numerical violation after disaggregating variable");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
LAB_00276bf6:
  lVar12 = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&dualVal.m_backend,0.0,(type *)0x0);
  for (lVar13 = 0;
      lVar13 < (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused; lVar13 = lVar13 + 1) {
    pNVar4 = (this->m_col).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    iVar2 = *(int *)((long)(&pNVar4->val + 1) + lVar12);
    if (iVar2 != this->m_i) {
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems._24_5_ = 0;
      result_1.m_backend.data._M_elems[7]._1_3_ = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend.data._M_elems[9]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_1.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)(pNVar4->val).m_backend.data._M_elems + lVar12),
                 &(y->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&dualVal.m_backend,&result_1.m_backend);
    }
    lVar12 = lVar12 + 0x3c;
  }
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 10;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems._24_5_ = 0;
  result_1.m_backend.data._M_elems[7]._1_3_ = 0;
  result_1.m_backend.data._M_elems._32_5_ = 0;
  result_1.m_backend.data._M_elems[9]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_1.m_backend,&(this->m_obj).m_backend,&dualVal.m_backend);
  result_2.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
  result_2.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
  result_2.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
  result_2.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
  result_2.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
  result_2.m_backend.data._M_elems[7] =
       (uint)(CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,
                       result_1.m_backend.data._M_elems._24_5_) >> 0x20);
  result_2.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
  result_2.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
  result_2.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
  result_2.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
  result_2.m_backend.exp = result_1.m_backend.exp;
  result_2.m_backend.neg = result_1.m_backend.neg;
  result_2.m_backend.fpclass = result_1.m_backend.fpclass;
  result_2.m_backend.prec_elem = result_1.m_backend.prec_elem;
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 10;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems._24_5_ = 0;
  result_1.m_backend.data._M_elems[7]._1_3_ = 0;
  result_1.m_backend.data._M_elems._32_5_ = 0;
  result_1.m_backend.data._M_elems[9]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_1.m_backend,&result_2.m_backend,&aij.m_backend);
  iVar2 = this->m_i;
  pnVar3 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar3[iVar2].m_backend.data._M_elems + 8) =
       CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,result_1.m_backend.data._M_elems._32_5_);
  puVar1 = pnVar3[iVar2].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,result_1.m_backend.data._M_elems._24_5_);
  *(undefined8 *)&pnVar3[iVar2].m_backend.data = result_1.m_backend.data._M_elems._0_8_;
  *(undefined8 *)(pnVar3[iVar2].m_backend.data._M_elems + 2) =
       result_1.m_backend.data._M_elems._8_8_;
  pnVar3[iVar2].m_backend.exp = result_1.m_backend.exp;
  pnVar3[iVar2].m_backend.neg = result_1.m_backend.neg;
  pnVar3[iVar2].m_backend.fpclass = result_1.m_backend.fpclass;
  pnVar3[iVar2].m_backend.prec_elem = result_1.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             ((r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  pVVar8 = cStatus->data;
  VVar10 = pVVar8[iVar11];
  if ((VVar10 & ~FIXED) == ON_UPPER) {
    pnVar3 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_3b8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar3[iVar11].m_backend.data._M_elems + 8);
    local_3b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar11].m_backend.data;
    local_3b8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar3[iVar11].m_backend.data._M_elems + 2);
    puVar1 = pnVar3[iVar11].m_backend.data._M_elems + 4;
    local_3b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_3b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_3b8.m_backend.exp = pnVar3[iVar11].m_backend.exp;
    local_3b8.m_backend.neg = pnVar3[iVar11].m_backend.neg;
    local_3b8.m_backend.fpclass = pnVar3[iVar11].m_backend.fpclass;
    local_3b8.m_backend.prec_elem = pnVar3[iVar11].m_backend.prec_elem;
    local_3f8.m_backend.data._M_elems[0] = (this->m_oldupper).m_backend.data._M_elems[0];
    local_3f8.m_backend.data._M_elems[1] = (this->m_oldupper).m_backend.data._M_elems[1];
    local_3f8.m_backend.data._M_elems[2] = (this->m_oldupper).m_backend.data._M_elems[2];
    local_3f8.m_backend.data._M_elems[3] = (this->m_oldupper).m_backend.data._M_elems[3];
    local_3f8.m_backend.data._M_elems[4] = (this->m_oldupper).m_backend.data._M_elems[4];
    local_3f8.m_backend.data._M_elems[5] = (this->m_oldupper).m_backend.data._M_elems[5];
    local_3f8.m_backend.data._M_elems[6] = (this->m_oldupper).m_backend.data._M_elems[6];
    local_3f8.m_backend.data._M_elems[7] = (this->m_oldupper).m_backend.data._M_elems[7];
    local_3f8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_oldupper).m_backend.data._M_elems + 8);
    local_3f8.m_backend.exp = (this->m_oldupper).m_backend.exp;
    local_3f8.m_backend.neg = (this->m_oldupper).m_backend.neg;
    local_3f8.m_backend.fpclass = (this->m_oldupper).m_backend.fpclass;
    local_3f8.m_backend.prec_elem = (this->m_oldupper).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_110,this);
    bVar6 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_3b8,&local_3f8,&local_110);
    if (!bVar6) {
      pVVar8 = cStatus->data;
      VVar10 = pVVar8[iVar11];
      goto LAB_00276e64;
    }
LAB_00276f31:
    cStatus->data[iVar11] = BASIC;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)
               ((r->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar11),0.0);
    iVar11 = this->m_j;
    pnVar3 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_4b8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar3[iVar11].m_backend.data._M_elems + 8);
    local_4b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar11].m_backend.data;
    local_4b8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar3[iVar11].m_backend.data._M_elems + 2);
    puVar1 = pnVar3[iVar11].m_backend.data._M_elems + 4;
    local_4b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_4b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_4b8.m_backend.exp = pnVar3[iVar11].m_backend.exp;
    local_4b8.m_backend.neg = pnVar3[iVar11].m_backend.neg;
    local_4b8.m_backend.fpclass = pnVar3[iVar11].m_backend.fpclass;
    local_4b8.m_backend.prec_elem = pnVar3[iVar11].m_backend.prec_elem;
    local_4f8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 8);
    local_4f8.m_backend.data._M_elems[0] = (this->m_upper).m_backend.data._M_elems[0];
    local_4f8.m_backend.data._M_elems[1] = (this->m_upper).m_backend.data._M_elems[1];
    local_4f8.m_backend.data._M_elems[2] = (this->m_upper).m_backend.data._M_elems[2];
    local_4f8.m_backend.data._M_elems[3] = (this->m_upper).m_backend.data._M_elems[3];
    local_4f8.m_backend.data._M_elems[4] = (this->m_upper).m_backend.data._M_elems[4];
    local_4f8.m_backend.data._M_elems[5] = (this->m_upper).m_backend.data._M_elems[5];
    local_4f8.m_backend.data._M_elems[6] = (this->m_upper).m_backend.data._M_elems[6];
    local_4f8.m_backend.data._M_elems[7] = (this->m_upper).m_backend.data._M_elems[7];
    local_4f8.m_backend.exp = (this->m_upper).m_backend.exp;
    local_4f8.m_backend.neg = (this->m_upper).m_backend.neg;
    local_4f8.m_backend.fpclass = (this->m_upper).m_backend.fpclass;
    local_4f8.m_backend.prec_elem = (this->m_upper).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_180,this);
    bVar6 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_4b8,&local_4f8,&local_180);
    iVar11 = this->m_j;
    if (bVar6) {
      pVVar8 = cStatus->data;
      VVar10 = ON_UPPER;
    }
    else {
      pnVar3 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_538.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar3[iVar11].m_backend.data._M_elems + 8);
      local_538.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar11].m_backend.data;
      local_538.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar3[iVar11].m_backend.data._M_elems + 2);
      puVar1 = pnVar3[iVar11].m_backend.data._M_elems + 4;
      local_538.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_538.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_538.m_backend.exp = pnVar3[iVar11].m_backend.exp;
      local_538.m_backend.neg = pnVar3[iVar11].m_backend.neg;
      local_538.m_backend.fpclass = pnVar3[iVar11].m_backend.fpclass;
      local_538.m_backend.prec_elem = pnVar3[iVar11].m_backend.prec_elem;
      local_578.m_backend.data._M_elems[0] = (this->m_lower).m_backend.data._M_elems[0];
      local_578.m_backend.data._M_elems[1] = (this->m_lower).m_backend.data._M_elems[1];
      local_578.m_backend.data._M_elems[2] = (this->m_lower).m_backend.data._M_elems[2];
      local_578.m_backend.data._M_elems[3] = (this->m_lower).m_backend.data._M_elems[3];
      local_578.m_backend.data._M_elems[4] = (this->m_lower).m_backend.data._M_elems[4];
      local_578.m_backend.data._M_elems[5] = (this->m_lower).m_backend.data._M_elems[5];
      local_578.m_backend.data._M_elems[6] = (this->m_lower).m_backend.data._M_elems[6];
      local_578.m_backend.data._M_elems[7] = (this->m_lower).m_backend.data._M_elems[7];
      local_578.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 8);
      local_578.m_backend.exp = (this->m_lower).m_backend.exp;
      local_578.m_backend.neg = (this->m_lower).m_backend.neg;
      local_578.m_backend.fpclass = (this->m_lower).m_backend.fpclass;
      local_578.m_backend.prec_elem = (this->m_lower).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_1b8,this);
      bVar6 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_538,&local_578,&local_1b8);
      if (!bVar6) {
        pdVar9 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&result_1.m_backend,*pdVar9,(type *)0x0);
        tVar5 = boost::multiprecision::operator>=
                          (&this->m_upper,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_1.m_backend);
        if (tVar5) {
          pdVar9 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_5b0,-*pdVar9,(type *)0x0);
          tVar5 = boost::multiprecision::operator<=
                            (&this->m_lower,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_5b0);
          if (tVar5) {
            iVar11 = this->m_j;
            pVVar8 = cStatus->data;
            VVar10 = ZERO;
            goto LAB_002770e6;
          }
        }
        this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&result_1,"XMAISM unexpected basis status in aggregation unsimplifier."
                   ,(allocator *)&local_5b0);
        SPxInternalCodeException::SPxInternalCodeException(this_00,(string *)&result_1);
        __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      iVar11 = this->m_j;
      pVVar8 = cStatus->data;
      VVar10 = ON_LOWER;
    }
  }
  else {
LAB_00276e64:
    if (VVar10 - ON_LOWER < 2) {
      pnVar3 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_438.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar3[iVar11].m_backend.data._M_elems + 8);
      local_438.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar11].m_backend.data;
      local_438.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar3[iVar11].m_backend.data._M_elems + 2);
      puVar1 = pnVar3[iVar11].m_backend.data._M_elems + 4;
      local_438.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_438.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_438.m_backend.exp = pnVar3[iVar11].m_backend.exp;
      local_438.m_backend.neg = pnVar3[iVar11].m_backend.neg;
      local_438.m_backend.fpclass = pnVar3[iVar11].m_backend.fpclass;
      local_438.m_backend.prec_elem = pnVar3[iVar11].m_backend.prec_elem;
      local_478.m_backend.data._M_elems[0] = (this->m_oldlower).m_backend.data._M_elems[0];
      local_478.m_backend.data._M_elems[1] = (this->m_oldlower).m_backend.data._M_elems[1];
      local_478.m_backend.data._M_elems[2] = (this->m_oldlower).m_backend.data._M_elems[2];
      local_478.m_backend.data._M_elems[3] = (this->m_oldlower).m_backend.data._M_elems[3];
      local_478.m_backend.data._M_elems[4] = (this->m_oldlower).m_backend.data._M_elems[4];
      local_478.m_backend.data._M_elems[5] = (this->m_oldlower).m_backend.data._M_elems[5];
      local_478.m_backend.data._M_elems[6] = (this->m_oldlower).m_backend.data._M_elems[6];
      local_478.m_backend.data._M_elems[7] = (this->m_oldlower).m_backend.data._M_elems[7];
      local_478.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_oldlower).m_backend.data._M_elems + 8);
      local_478.m_backend.exp = (this->m_oldlower).m_backend.exp;
      local_478.m_backend.neg = (this->m_oldlower).m_backend.neg;
      local_478.m_backend.fpclass = (this->m_oldlower).m_backend.fpclass;
      local_478.m_backend.prec_elem = (this->m_oldlower).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_148,this);
      bVar6 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_438,&local_478,&local_148);
      if (bVar6) goto LAB_00276f31;
      pVVar8 = cStatus->data;
    }
    iVar11 = this->m_j;
    VVar10 = BASIC;
  }
LAB_002770e6:
  pVVar8[iVar11] = VVar10;
  rStatus->data[this->m_i] = ON_UPPER;
  return;
}

Assistant:

void SPxMainSM<R>::AggregationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];
   int active_idx = -1;

   assert(m_row.size() == 2);

   for(int k = 0; k < 2; ++k)
   {
      if(m_row.index(k) != m_j)
      {
         active_idx = m_row.index(k);
         val = m_row.value(k) * x[active_idx];
      }
   }

   assert(active_idx >= 0);

   R scale = maxAbs(m_rhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_rhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_rhs;

   if(isOptimal && (LT(x[m_j], m_lower, this->feastol()) || GT(x[m_j], m_upper, this->feastol())))
   {
      SPX_MSG_ERROR(std::cerr << "EMAISM: numerical violation after disaggregating variable" << std::endl;
                   )
   }

   // dual:
   R dualVal = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         dualVal += m_col.value(k) * y[m_col.index(k)];
   }

   z = m_obj - dualVal;

   y[m_i] = z / aij;
   r[m_j] = 0.0;

   // basis:
   if(((cStatus[active_idx] == SPxSolverBase<R>::ON_UPPER
         || cStatus[active_idx] == SPxSolverBase<R>::FIXED)
         && NE(x[active_idx], m_oldupper, this->feastol())) ||
         ((cStatus[active_idx] == SPxSolverBase<R>::ON_LOWER
           || cStatus[active_idx] == SPxSolverBase<R>::FIXED)
          && NE(x[active_idx], m_oldlower, this->feastol())))
   {
      cStatus[active_idx] = SPxSolverBase<R>::BASIC;
      r[active_idx] = 0.0;
      assert(NE(m_upper, m_lower, this->epsilon()));

      if(EQ(x[m_j], m_upper, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(EQ(x[m_j], m_lower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(m_upper >= R(infinity) && m_lower <= R(-infinity))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM unexpected basis status in aggregation unsimplifier.");
   }
   else
   {
      cStatus[m_j] = SPxSolverBase<R>::BASIC;
   }

   // sides may not be equal and we always only consider the rhs during aggregation, so set ON_UPPER
   // (in theory and with exact arithmetic setting it to FIXED would be correct)
   rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}